

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpDiscovery.c
# Opt level: O3

UpnpDiscovery * UpnpDiscovery_new(void)

{
  UpnpDiscovery *pUVar1;
  UpnpString *pUVar2;
  
  pUVar1 = (UpnpDiscovery *)calloc(1,200);
  if (pUVar1 != (UpnpDiscovery *)0x0) {
    pUVar2 = UpnpString_new();
    pUVar1->m_DeviceID = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_DeviceType = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_ServiceType = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_ServiceVer = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_Location = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_Os = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_Date = pUVar2;
    pUVar2 = UpnpString_new();
    pUVar1->m_Ext = pUVar2;
  }
  return pUVar1;
}

Assistant:

UpnpDiscovery *UpnpDiscovery_new(void)
{
	struct s_UpnpDiscovery *p = calloc(1, sizeof(struct s_UpnpDiscovery));

	if (!p)
		return 0;

	/*p->m_ErrCode = 0;*/
	/*p->m_Expires = 0;*/
	p->m_DeviceID = UpnpString_new();
	p->m_DeviceType = UpnpString_new();
	p->m_ServiceType = UpnpString_new();
	p->m_ServiceVer = UpnpString_new();
	p->m_Location = UpnpString_new();
	p->m_Os = UpnpString_new();
	p->m_Date = UpnpString_new();
	p->m_Ext = UpnpString_new();
	/* memset(&p->m_DestAddr, 0, sizeof (struct sockaddr_storage)); */

	return (UpnpDiscovery *)p;
}